

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::MultiTextureSamplerTest::MultiTextureSamplerTest
          (MultiTextureSamplerTest *this,TestContext *testCtx,RenderContext *renderCtx,
          TestSpec *spec)

{
  GLenum GVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  deUint32 seed;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,spec->name,spec->desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiTextureSamplerTest_01e77558;
  this->m_renderCtx = renderCtx;
  this->m_program = (ShaderProgram *)0x0;
  this->m_target = spec->target;
  GVar4 = (spec->textureState1).minFilter;
  GVar5 = (spec->textureState1).magFilter;
  GVar6 = (spec->textureState1).wrapT;
  GVar7 = (spec->textureState1).wrapS;
  GVar1 = (spec->textureState1).wrapR;
  GVar2 = (spec->textureState1).minLod;
  GVar3 = (spec->textureState1).maxLod;
  (this->m_textureState1).wrapS = (spec->textureState1).wrapS;
  (this->m_textureState1).wrapR = GVar1;
  (this->m_textureState1).minLod = GVar2;
  (this->m_textureState1).maxLod = GVar3;
  (this->m_textureState1).minFilter = GVar4;
  (this->m_textureState1).magFilter = GVar5;
  (this->m_textureState1).wrapT = GVar6;
  (this->m_textureState1).wrapS = GVar7;
  GVar4 = (spec->textureState2).minFilter;
  GVar5 = (spec->textureState2).magFilter;
  GVar6 = (spec->textureState2).wrapT;
  GVar7 = (spec->textureState2).wrapS;
  GVar1 = (spec->textureState2).wrapR;
  GVar2 = (spec->textureState2).minLod;
  GVar3 = (spec->textureState2).maxLod;
  (this->m_textureState2).wrapS = (spec->textureState2).wrapS;
  (this->m_textureState2).wrapR = GVar1;
  (this->m_textureState2).minLod = GVar2;
  (this->m_textureState2).maxLod = GVar3;
  (this->m_textureState2).minFilter = GVar4;
  (this->m_textureState2).magFilter = GVar5;
  (this->m_textureState2).wrapT = GVar6;
  (this->m_textureState2).wrapS = GVar7;
  GVar1 = (spec->samplerState).magFilter;
  GVar4 = (spec->samplerState).wrapT;
  GVar5 = (spec->samplerState).wrapS;
  GVar6 = (spec->samplerState).wrapS;
  GVar7 = (spec->samplerState).wrapR;
  GVar2 = (spec->samplerState).minLod;
  GVar3 = (spec->samplerState).maxLod;
  (this->m_samplerState).minFilter = (spec->samplerState).minFilter;
  (this->m_samplerState).magFilter = GVar1;
  (this->m_samplerState).wrapT = GVar4;
  (this->m_samplerState).wrapS = GVar5;
  (this->m_samplerState).wrapS = GVar6;
  (this->m_samplerState).wrapR = GVar7;
  (this->m_samplerState).minLod = GVar2;
  (this->m_samplerState).maxLod = GVar3;
  seed = deStringHash(spec->name);
  deRandom_init(&(this->m_random).m_rnd,seed);
  return;
}

Assistant:

MultiTextureSamplerTest::MultiTextureSamplerTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const TestSpec& spec)
	: TestCase			(testCtx, spec.name, spec.desc)
	, m_renderCtx		(renderCtx)
	, m_program			(NULL)
	, m_target			(spec.target)
	, m_textureState1	(spec.textureState1)
	, m_textureState2	(spec.textureState2)
	, m_samplerState	(spec.samplerState)
	, m_random			(deStringHash(spec.name))
{
}